

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QPainter * __thiscall QWidget::sharedPainter(QWidget *this)

{
  char cVar1;
  QPainter *pQVar2;
  long lVar3;
  QPainter *pQVar4;
  
  if ((((*(QWidgetPrivate **)&this->field_0x8)->redirectDev == (QPaintDevice *)0x0) ||
      (pQVar2 = QWidgetPrivate::sharedPainter(*(QWidgetPrivate **)&this->field_0x8),
      pQVar2 == (QPainter *)0x0)) || (cVar1 = QPainter::isActive(), cVar1 == '\0')) {
    pQVar4 = (QPainter *)0x0;
  }
  else {
    QPainter::paintEngine();
    lVar3 = QPaintEngine::paintDevice();
    pQVar4 = (QPainter *)0x0;
    if (lVar3 == *(long *)(*(long *)&this->field_0x8 + 0xa8)) {
      pQVar4 = pQVar2;
    }
  }
  return pQVar4;
}

Assistant:

QPainter *QWidget::sharedPainter() const
{
    // Someone sent a paint event directly to the widget
    if (!d_func()->redirectDev)
        return nullptr;

    QPainter *sp = d_func()->sharedPainter();
    if (!sp || !sp->isActive())
        return nullptr;

    if (sp->paintEngine()->paintDevice() != d_func()->redirectDev)
        return nullptr;

    return sp;
}